

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

void __thiscall aiMetadata::Add<aiString>(aiMetadata *this,string *key,aiString *value)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  ulong uVar3;
  aiString *paVar4;
  ulong uVar5;
  aiMetadataEntry *paVar6;
  aiMetadataEntry *paVar7;
  aiMetadataEntry *paVar8;
  aiString *local_58;
  uint local_34;
  uint i;
  aiMetadataEntry *new_values;
  aiString *new_keys;
  aiString *value_local;
  string *key_local;
  aiMetadata *this_local;
  
  uVar5 = CONCAT44(0,this->mNumProperties + 1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar3 = SUB168(auVar1 * ZEXT816(0x404),0);
  if (SUB168(auVar1 * ZEXT816(0x404),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  paVar4 = (aiString *)operator_new__(uVar3);
  if (uVar5 != 0) {
    local_58 = paVar4;
    do {
      aiString::aiString(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != paVar4 + uVar5);
  }
  auVar1 = ZEXT416(this->mNumProperties + 1) * ZEXT816(0x10);
  uVar5 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  paVar6 = (aiMetadataEntry *)operator_new__(uVar5);
  for (local_34 = 0; local_34 < this->mNumProperties; local_34 = local_34 + 1) {
    aiString::operator=(paVar4 + local_34,this->mKeys + local_34);
    paVar8 = this->mValues + local_34;
    paVar7 = paVar6 + local_34;
    uVar2 = *(undefined4 *)&paVar8->field_0x4;
    paVar7->mType = paVar8->mType;
    *(undefined4 *)&paVar7->field_0x4 = uVar2;
    paVar7->mData = paVar8->mData;
  }
  if (this->mKeys != (aiString *)0x0) {
    operator_delete__(this->mKeys);
  }
  if (this->mValues != (aiMetadataEntry *)0x0) {
    operator_delete__(this->mValues);
  }
  this->mKeys = paVar4;
  this->mValues = paVar6;
  this->mNumProperties = this->mNumProperties + 1;
  Set<aiString>(this,this->mNumProperties - 1,key,value);
  return;
}

Assistant:

inline
    void Add(const std::string& key, const T& value) {
		aiString* new_keys = new aiString[mNumProperties + 1];
		aiMetadataEntry* new_values = new aiMetadataEntry[mNumProperties + 1];

		for(unsigned int i = 0; i < mNumProperties; ++i)
		{
			new_keys[i] = mKeys[i];
			new_values[i] = mValues[i];
		}

		delete[] mKeys;
		delete[] mValues;

		mKeys = new_keys;
		mValues = new_values;

		mNumProperties++;

		Set(mNumProperties - 1, key, value);
	}